

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O3

Gia_Man_t * Gia_ManSpecReduceTrace(Gia_Man_t *p,Vec_Int_t *vTrace,Vec_Int_t *vMap)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  Vec_Int_t *vXorLits;
  int *piVar5;
  Gia_Man_t *p_00;
  size_t sVar6;
  char *pcVar7;
  Gia_Obj_t *pGVar8;
  Vec_Int_t *pVVar9;
  Gia_Man_t *pGVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  
  if (p->pReprs == (Gia_Rpr_t *)0x0) {
    Abc_Print(1,"Gia_ManSpecReduce(): Equivalence classes are not available.\n");
    pGVar10 = (Gia_Man_t *)0x0;
  }
  else {
    vTrace->nSize = 0;
    vXorLits = (Vec_Int_t *)malloc(0x10);
    vXorLits->nCap = 1000;
    vXorLits->nSize = 0;
    piVar5 = (int *)malloc(4000);
    vXorLits->pArray = piVar5;
    Gia_ManSetPhase(p);
    Gia_ManFillValue(p);
    p_00 = Gia_ManStart(p->nObjs);
    pcVar2 = p->pName;
    if (pcVar2 == (char *)0x0) {
      pcVar7 = (char *)0x0;
    }
    else {
      sVar6 = strlen(pcVar2);
      pcVar7 = (char *)malloc(sVar6 + 1);
      strcpy(pcVar7,pcVar2);
    }
    p_00->pName = pcVar7;
    pcVar2 = p->pSpec;
    if (pcVar2 == (char *)0x0) {
      pcVar7 = (char *)0x0;
    }
    else {
      sVar6 = strlen(pcVar2);
      pcVar7 = (char *)malloc(sVar6 + 1);
      strcpy(pcVar7,pcVar2);
    }
    p_00->pSpec = pcVar7;
    Gia_ManHashAlloc(p_00);
    p->pObjs->Value = 0;
    pVVar9 = p->vCis;
    if (0 < pVVar9->nSize) {
      lVar16 = 0;
      do {
        iVar13 = pVVar9->pArray[lVar16];
        if (((long)iVar13 < 0) || (p->nObjs <= iVar13)) goto LAB_001ff94c;
        pGVar3 = p->pObjs;
        if (pGVar3 == (Gia_Obj_t *)0x0) break;
        pGVar8 = Gia_ManAppendObj(p_00);
        uVar12 = *(ulong *)pGVar8;
        *(ulong *)pGVar8 = uVar12 | 0x9fffffff;
        *(ulong *)pGVar8 =
             uVar12 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar4 = p_00->pObjs;
        if ((pGVar8 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar8)) {
LAB_001ff96b:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar4) >> 2) * -0x55555555);
        pGVar4 = p_00->pObjs;
        if ((pGVar8 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar8)) goto LAB_001ff96b;
        pGVar3[iVar13].Value = (int)((ulong)((long)pGVar8 - (long)pGVar4) >> 2) * 0x55555556;
        lVar16 = lVar16 + 1;
        pVVar9 = p->vCis;
      } while (lVar16 < pVVar9->nSize);
    }
    iVar13 = p->nRegs;
    if (0 < iVar13) {
      iVar14 = 0;
      do {
        iVar1 = p->vCis->nSize;
        uVar11 = (iVar1 - iVar13) + iVar14;
        if (((int)uVar11 < 0) || (iVar1 <= (int)uVar11)) goto LAB_001ff98a;
        iVar1 = p->vCis->pArray[uVar11];
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_001ff94c;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        Gia_ManSpecBuild(p_00,p,p->pObjs + iVar1,vXorLits,0,1,vTrace,(Vec_Int_t *)0x0,vMap);
        iVar14 = iVar14 + 1;
        iVar13 = p->nRegs;
      } while (iVar14 < iVar13);
    }
    pVVar9 = p->vCos;
    uVar12 = (ulong)(uint)pVVar9->nSize;
    if (0 < pVVar9->nSize) {
      lVar16 = 0;
      do {
        iVar13 = pVVar9->pArray[lVar16];
        if (((long)iVar13 < 0) || (p->nObjs <= iVar13)) goto LAB_001ff94c;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar3 = p->pObjs + iVar13;
        Gia_ManSpecReduce_rec
                  (p_00,p,pGVar3 + -(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff),vXorLits,0,1,
                   vTrace,(Vec_Int_t *)0x0,vMap);
        lVar16 = lVar16 + 1;
        pVVar9 = p->vCos;
        uVar12 = (ulong)pVVar9->nSize;
      } while (lVar16 < (long)uVar12);
      iVar13 = p->nRegs;
    }
    if (iVar13 < (int)uVar12) {
      lVar16 = 0;
      do {
        if ((int)uVar12 <= lVar16) goto LAB_001ff98a;
        iVar13 = pVVar9->pArray[lVar16];
        if (((long)iVar13 < 0) || (p->nObjs <= iVar13)) goto LAB_001ff94c;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar3 = p->pObjs + iVar13;
        uVar15 = (uint)*(undefined8 *)pGVar3;
        uVar11 = pGVar3[-(ulong)(uVar15 & 0x1fffffff)].Value;
        if ((int)uVar11 < 0) goto LAB_001ff9a9;
        Gia_ManAppendCo(p_00,uVar15 >> 0x1d & 1 ^ uVar11);
        lVar16 = lVar16 + 1;
        pVVar9 = p->vCos;
        uVar12 = (ulong)pVVar9->nSize;
      } while (lVar16 < (long)(uVar12 - (long)p->nRegs));
    }
    iVar13 = vXorLits->nSize;
    if (0 < iVar13) {
      lVar16 = 0;
      do {
        Gia_ManAppendCo(p_00,vXorLits->pArray[lVar16]);
        lVar16 = lVar16 + 1;
        iVar13 = vXorLits->nSize;
      } while (lVar16 < iVar13);
    }
    if (iVar13 == 0) {
      Abc_Print(1,"Speculatively reduced model has no primary outputs.\n");
      Gia_ManAppendCo(p_00,0);
    }
    iVar13 = p->nRegs;
    if (0 < iVar13) {
      iVar14 = 0;
      do {
        iVar1 = p->vCos->nSize;
        uVar11 = (iVar1 - iVar13) + iVar14;
        if (((int)uVar11 < 0) || (iVar1 <= (int)uVar11)) {
LAB_001ff98a:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar13 = p->vCos->pArray[uVar11];
        if (((long)iVar13 < 0) || (p->nObjs <= iVar13)) {
LAB_001ff94c:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar3 = p->pObjs + iVar13;
        uVar15 = (uint)*(undefined8 *)pGVar3;
        uVar11 = pGVar3[-(ulong)(uVar15 & 0x1fffffff)].Value;
        if ((int)uVar11 < 0) {
LAB_001ff9a9:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        Gia_ManAppendCo(p_00,uVar15 >> 0x1d & 1 ^ uVar11);
        iVar14 = iVar14 + 1;
        iVar13 = p->nRegs;
      } while (iVar14 < iVar13);
    }
    Gia_ManHashStop(p_00);
    if (vXorLits->pArray != (int *)0x0) {
      free(vXorLits->pArray);
    }
    free(vXorLits);
    Gia_ManSetRegNum(p_00,p->nRegs);
    pGVar10 = Gia_ManCleanup(p_00);
    Gia_ManStop(p_00);
  }
  return pGVar10;
}

Assistant:

Gia_Man_t * Gia_ManSpecReduceTrace( Gia_Man_t * p, Vec_Int_t * vTrace, Vec_Int_t * vMap )
{
    Vec_Int_t * vXorLits;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, iLitNew;
    if ( !p->pReprs )
    {
        Abc_Print( 1, "Gia_ManSpecReduce(): Equivalence classes are not available.\n" );
        return NULL;
    }
    Vec_IntClear( vTrace );
    vXorLits = Vec_IntAlloc( 1000 );
    Gia_ManSetPhase( p );
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachRo( p, pObj, i )
        Gia_ManSpecBuild( pNew, p, pObj, vXorLits, 0, 1, vTrace, NULL, vMap );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManSpecReduce_rec( pNew, p, Gia_ObjFanin0(pObj), vXorLits, 0, 1, vTrace, NULL, vMap );
    Gia_ManForEachPo( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Vec_IntForEachEntry( vXorLits, iLitNew, i )
        Gia_ManAppendCo( pNew, iLitNew );
    if ( Vec_IntSize(vXorLits) == 0 )
    {
        Abc_Print( 1, "Speculatively reduced model has no primary outputs.\n" );
        Gia_ManAppendCo( pNew, 0 );
    }
    Gia_ManForEachRi( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Vec_IntFree( vXorLits );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}